

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void mspace_free(mspace msp,void *mem)

{
  long *plVar1;
  ulong *puVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  ulong *puVar12;
  ulong *puVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  size_t __len;
  ulong uVar18;
  ulong *puVar19;
  
  if (mem == (void *)0x0) {
    return;
  }
  puVar19 = (ulong *)((long)mem + -0x10);
  puVar10 = *(ulong **)((long)msp + 0x18);
  if ((puVar19 < puVar10) || (uVar18 = *(ulong *)((long)mem + -8), ((uint)uVar18 & 3) == 1))
  goto LAB_001385cd;
  __len = uVar18 & 0xfffffffffffffff8;
  puVar13 = (ulong *)((long)puVar19 + __len);
  if ((uVar18 & 1) == 0) {
    uVar9 = *puVar19;
    if ((uVar18 & 2) == 0) {
      __len = __len + 0x20 + uVar9;
      iVar7 = munmap((void *)((long)puVar19 - uVar9),__len);
      iVar15 = 2;
      if (iVar7 == 0) {
        *(long *)((long)msp + 0x358) = *(long *)((long)msp + 0x358) - __len;
      }
    }
    else {
      puVar19 = (ulong *)((long)puVar19 - uVar9);
      __len = __len + uVar9;
      if (puVar10 <= puVar19) {
        if (puVar19 == *(ulong **)((long)msp + 0x20)) {
          uVar18 = puVar13[1];
          if ((~(uint)uVar18 & 3) == 0) {
            *(size_t *)((long)msp + 8) = __len;
            puVar13[1] = uVar18 & 0xfffffffffffffffe;
            puVar19[1] = __len | 1;
            *puVar13 = __len;
            iVar15 = 2;
            goto LAB_00138029;
          }
        }
        else {
          if (0xff < uVar9) {
            puVar12 = (ulong *)puVar19[3];
            uVar18 = puVar19[6];
            if (puVar12 == puVar19) {
              puVar12 = (ulong *)puVar19[5];
              if (puVar12 != (ulong *)0x0) {
                puVar11 = puVar19 + 5;
LAB_001383e0:
                do {
                  if (puVar12[5] == 0) {
                    if (puVar12[4] == 0) goto code_r0x001383f4;
                    puVar11 = puVar12 + 4;
                  }
                  else {
                    puVar11 = puVar12 + 5;
                  }
                  puVar12 = (ulong *)*puVar11;
                } while( true );
              }
              puVar12 = (ulong *)puVar19[4];
              if (puVar12 != (ulong *)0x0) {
                puVar11 = puVar19 + 4;
                goto LAB_001383e0;
              }
              puVar12 = (ulong *)0x0;
            }
            else {
              puVar11 = (ulong *)puVar19[2];
              if (((puVar11 < puVar10) || ((ulong *)puVar11[3] != puVar19)) ||
                 ((ulong *)puVar12[2] != puVar19)) goto LAB_001385cd;
              puVar11[3] = (ulong)puVar12;
              puVar12[2] = (ulong)puVar11;
            }
            goto LAB_00138404;
          }
          puVar11 = (ulong *)puVar19[2];
          puVar2 = (ulong *)puVar19[3];
          puVar12 = (ulong *)((long)msp + (uVar9 >> 3) * 0x10 + 0x48);
          if ((puVar11 != puVar12) && ((puVar11 < puVar10 || ((ulong *)puVar11[3] != puVar19))))
          goto LAB_001385cd;
          if (puVar2 == puVar11) {
            bVar5 = (byte)(uVar9 >> 3) & 0x1f;
            *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
          }
          else {
            if ((puVar2 != puVar12) && ((puVar2 < puVar10 || ((ulong *)puVar2[2] != puVar19))))
            goto LAB_001385cd;
            puVar11[3] = (ulong)puVar2;
            puVar2[2] = (ulong)puVar11;
          }
        }
        bVar6 = true;
        iVar15 = 0;
        goto LAB_0013808b;
      }
      iVar15 = 5;
    }
LAB_00138029:
    bVar6 = false;
    goto LAB_0013808b;
  }
LAB_00138093:
  iVar15 = 0;
  if ((puVar19 < puVar13) && (uVar18 = puVar13[1], (uVar18 & 1) != 0)) {
    if ((uVar18 & 2) != 0) {
      puVar13[1] = uVar18 & 0xfffffffffffffffe;
      puVar19[1] = __len | 1;
      *(size_t *)((long)puVar19 + __len) = __len;
      goto LAB_00138153;
    }
    if (puVar13 == *(ulong **)((long)msp + 0x28)) {
      uVar18 = __len + *(long *)((long)msp + 0x10);
      *(ulong *)((long)msp + 0x10) = uVar18;
      *(ulong **)((long)msp + 0x28) = puVar19;
      puVar19[1] = uVar18 | 1;
      if (puVar19 == *(ulong **)((long)msp + 0x20)) {
        *(undefined8 *)((long)msp + 0x20) = 0;
        *(undefined8 *)((long)msp + 8) = 0;
      }
      iVar15 = 2;
      if (*(ulong *)((long)msp + 0x30) < uVar18) {
        sys_trim((mstate)msp,0);
      }
      goto LAB_001385b1;
    }
    if (puVar13 != *(ulong **)((long)msp + 0x20)) {
      if (0xff < uVar18) {
        puVar10 = (ulong *)puVar13[3];
        uVar9 = puVar13[6];
        if (puVar10 == puVar13) {
          puVar10 = (ulong *)puVar13[5];
          if (puVar10 != (ulong *)0x0) {
            puVar12 = puVar13 + 5;
LAB_001384c9:
            do {
              if (puVar10[5] == 0) {
                if (puVar10[4] == 0) goto code_r0x001384dd;
                puVar12 = puVar10 + 4;
              }
              else {
                puVar12 = puVar10 + 5;
              }
              puVar10 = (ulong *)*puVar12;
            } while( true );
          }
          puVar10 = (ulong *)puVar13[4];
          if (puVar10 != (ulong *)0x0) {
            puVar12 = puVar13 + 4;
            goto LAB_001384c9;
          }
          puVar10 = (ulong *)0x0;
        }
        else {
          uVar3 = puVar13[2];
          if (((uVar3 < *(ulong *)((long)msp + 0x18)) || (*(ulong **)(uVar3 + 0x18) != puVar13)) ||
             ((ulong *)puVar10[2] != puVar13)) goto LAB_001385cd;
          *(ulong **)(uVar3 + 0x18) = puVar10;
          puVar10[2] = uVar3;
        }
        goto LAB_001384ee;
      }
      uVar3 = puVar13[2];
      uVar4 = puVar13[3];
      uVar9 = (long)msp + (uVar18 >> 3) * 0x10 + 0x48;
      if ((uVar3 != uVar9) &&
         ((uVar3 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar3 + 0x18) != puVar13))))
      goto LAB_001385cd;
      if (uVar4 == uVar3) {
        bVar5 = (byte)(uVar18 >> 3) & 0x1f;
        *(uint *)msp = *msp & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
      }
      else {
        if ((uVar4 != uVar9) &&
           ((uVar4 < *(ulong *)((long)msp + 0x18) || (*(ulong **)(uVar4 + 0x10) != puVar13))))
        goto LAB_001385cd;
        *(ulong *)(uVar3 + 0x18) = uVar4;
        *(ulong *)(uVar4 + 0x10) = uVar3;
      }
      goto LAB_0013857e;
    }
    uVar18 = __len + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar18;
    *(ulong **)((long)msp + 0x20) = puVar19;
    puVar19[1] = uVar18 | 1;
    *(ulong *)((long)puVar19 + uVar18) = uVar18;
LAB_00138247:
    iVar15 = 2;
  }
LAB_001385b1:
  if (iVar15 == 2) {
    return;
  }
LAB_001385cd:
  abort();
code_r0x001383f4:
  if (puVar11 < puVar10) goto LAB_001385cd;
  *puVar11 = 0;
LAB_00138404:
  iVar7 = 0;
  bVar6 = true;
  iVar15 = 0;
  if (uVar18 != 0) {
    uVar8 = (uint)puVar19[7];
    iVar15 = iVar7;
    if (puVar19 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
      *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar12;
      if (puVar12 == (ulong *)0x0) {
        bVar5 = (byte)uVar8 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        goto LAB_00138452;
      }
    }
    else {
      if (uVar18 < *(ulong *)((long)msp + 0x18)) goto LAB_001385cd;
      if (*(ulong **)(uVar18 + 0x20) == puVar19) {
        *(ulong **)(uVar18 + 0x20) = puVar12;
      }
      else {
        *(ulong **)(uVar18 + 0x28) = puVar12;
      }
LAB_00138452:
      if (puVar12 == (ulong *)0x0) goto LAB_0013808b;
    }
    puVar10 = *(ulong **)((long)msp + 0x18);
    if (puVar12 < puVar10) goto LAB_001385cd;
    puVar12[6] = uVar18;
    puVar11 = (ulong *)puVar19[4];
    if (puVar11 != (ulong *)0x0) {
      if (puVar11 < puVar10) goto LAB_001385cd;
      puVar12[4] = (ulong)puVar11;
      puVar11[6] = (ulong)puVar12;
    }
    uVar18 = puVar19[5];
    if (uVar18 != 0) {
      if (uVar18 < *(ulong *)((long)msp + 0x18)) goto LAB_001385cd;
      puVar12[5] = uVar18;
      *(ulong **)(uVar18 + 0x30) = puVar12;
    }
  }
LAB_0013808b:
  if (bVar6) goto LAB_00138093;
  goto LAB_001385b1;
code_r0x001384dd:
  if (puVar12 < *(ulong **)((long)msp + 0x18)) goto LAB_001385cd;
  *puVar12 = 0;
LAB_001384ee:
  if (uVar9 != 0) {
    uVar8 = (uint)puVar13[7];
    if (puVar13 == *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600)) {
      *(ulong **)((long)msp + (ulong)uVar8 * 8 + 600) = puVar10;
      if (puVar10 == (ulong *)0x0) {
        bVar5 = (byte)uVar8 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        goto LAB_00138539;
      }
    }
    else {
      if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_001385cd;
      if (*(ulong **)(uVar9 + 0x20) == puVar13) {
        *(ulong **)(uVar9 + 0x20) = puVar10;
      }
      else {
        *(ulong **)(uVar9 + 0x28) = puVar10;
      }
LAB_00138539:
      if (puVar10 == (ulong *)0x0) goto LAB_0013857e;
    }
    puVar12 = *(ulong **)((long)msp + 0x18);
    if (puVar10 < puVar12) goto LAB_001385cd;
    puVar10[6] = uVar9;
    puVar11 = (ulong *)puVar13[4];
    if (puVar11 != (ulong *)0x0) {
      if (puVar11 < puVar12) goto LAB_001385cd;
      puVar10[4] = (ulong)puVar11;
      puVar11[6] = (ulong)puVar10;
    }
    uVar9 = puVar13[5];
    if (uVar9 != 0) {
      if (uVar9 < *(ulong *)((long)msp + 0x18)) goto LAB_001385cd;
      puVar10[5] = uVar9;
      *(ulong **)(uVar9 + 0x30) = puVar10;
    }
  }
LAB_0013857e:
  __len = (uVar18 & 0xfffffffffffffff8) + __len;
  puVar19[1] = __len | 1;
  *(size_t *)((long)puVar19 + __len) = __len;
  if (puVar19 == *(ulong **)((long)msp + 0x20)) {
    *(size_t *)((long)msp + 8) = __len;
    iVar15 = 2;
  }
  else {
LAB_00138153:
    if (__len < 0x100) {
      uVar18 = (long)msp + (__len >> 3) * 0x10 + 0x48;
      uVar8 = (uint)(__len >> 3);
      if ((*msp >> (uVar8 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << (uVar8 & 0x1f);
        uVar9 = uVar18;
      }
      else {
        uVar9 = *(ulong *)(uVar18 + 0x10);
        if (*(ulong *)(uVar18 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_001385cd;
      }
      *(ulong **)(uVar18 + 0x10) = puVar19;
      *(ulong **)(uVar9 + 0x18) = puVar19;
      puVar19[2] = uVar9;
      puVar19[3] = uVar18;
      goto LAB_00138247;
    }
    uVar8 = (uint)(__len >> 8);
    if (uVar8 == 0) {
      uVar16 = 0;
    }
    else {
      uVar16 = 0x1f;
      if (uVar8 < 0x10000) {
        uVar16 = ((uint)(__len >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar8)) & 0x3f)) & 1) +
                 LZCOUNT(uVar8) * 2 ^ 0x3e;
      }
    }
    puVar10 = (ulong *)((long)msp + (ulong)uVar16 * 8 + 600);
    *(uint *)(puVar19 + 7) = uVar16;
    puVar19[4] = 0;
    puVar19[5] = 0;
    if ((*(uint *)((long)msp + 4) >> (uVar16 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar16 & 0x1f);
      lVar14 = 0x10;
      lVar17 = 0x30;
      puVar13 = puVar19;
      puVar12 = puVar10;
      puVar11 = puVar19;
LAB_00138333:
      *puVar12 = (ulong)puVar19;
      *(ulong **)((long)puVar19 + lVar17) = puVar10;
      puVar19[3] = (ulong)puVar13;
      *(ulong **)((long)puVar19 + lVar14) = puVar11;
    }
    else {
      puVar13 = (ulong *)*puVar10;
      uVar18 = (ulong)(byte)(0x39 - (char)(uVar16 >> 1));
      if (uVar16 == 0x1f) {
        uVar18 = 0;
      }
      lVar14 = __len << (uVar18 & 0x3f);
      do {
        if ((puVar13[1] & 0xfffffffffffffff8) == __len) {
          if ((puVar13 < *(ulong **)((long)msp + 0x18)) ||
             (puVar10 = (ulong *)puVar13[2], puVar10 < *(ulong **)((long)msp + 0x18)))
          goto LAB_001385cd;
          puVar10[3] = (ulong)puVar19;
          lVar14 = 0x30;
          lVar17 = 0x10;
          puVar12 = puVar13 + 2;
          puVar11 = (ulong *)0x0;
          goto LAB_00138333;
        }
        puVar10 = (ulong *)puVar13[4 - (lVar14 >> 0x3f)];
        puVar12 = puVar10;
        if (puVar10 == (ulong *)0x0) {
          if (puVar13 + (4 - (lVar14 >> 0x3f)) < *(ulong **)((long)msp + 0x18)) goto LAB_001385cd;
          puVar13[4 - (lVar14 >> 0x3f)] = (ulong)puVar19;
          puVar19[6] = (ulong)puVar13;
          puVar19[3] = (ulong)puVar19;
          puVar19[2] = (ulong)puVar19;
          puVar12 = puVar13;
        }
        puVar13 = puVar12;
        lVar14 = lVar14 * 2;
      } while (puVar10 != (ulong *)0x0);
    }
    plVar1 = (long *)((long)msp + 0x38);
    *plVar1 = *plVar1 + -1;
    iVar15 = 2;
    if (*plVar1 == 0) {
      release_unused_segments((mstate)msp);
    }
  }
  goto LAB_001385b1;
}

Assistant:

void mspace_free(mspace msp, void* mem) {
  if (mem != 0) {
    mchunkptr p  = mem2chunk(mem);
#if FOOTERS
    mstate fm = get_mstate_for(p);
    (void)msp; /* placate people compiling -Wunused */
#else /* FOOTERS */
    mstate fm = (mstate)msp;
#endif /* FOOTERS */
    if (!ok_magic(fm)) {
      USAGE_ERROR_ACTION(fm, p);
      return;
    }
    if (!PREACTION(fm)) {
      check_inuse_chunk(fm, p);
      if (RTCHECK(ok_address(fm, p) && ok_inuse(p))) {
        size_t psize = chunksize(p);
        mchunkptr next = chunk_plus_offset(p, psize);
        if (!pinuse(p)) {
          size_t prevsize = p->prev_foot;
          if (is_mmapped(p)) {
            psize += prevsize + MMAP_FOOT_PAD;
            if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
              fm->footprint -= psize;
            goto postaction;
          }
          else {
            mchunkptr prev = chunk_minus_offset(p, prevsize);
            psize += prevsize;
            p = prev;
            if (RTCHECK(ok_address(fm, prev))) { /* consolidate backward */
              if (p != fm->dv) {
                unlink_chunk(fm, p, prevsize);
              }
              else if ((next->head & INUSE_BITS) == INUSE_BITS) {
                fm->dvsize = psize;
                set_free_with_pinuse(p, psize, next);
                goto postaction;
              }
            }
            else
              goto erroraction;
          }
        }

        if (RTCHECK(ok_next(p, next) && ok_pinuse(next))) {
          if (!cinuse(next)) {  /* consolidate forward */
            if (next == fm->top) {
              size_t tsize = fm->topsize += psize;
              fm->top = p;
              p->head = tsize | PINUSE_BIT;
              if (p == fm->dv) {
                fm->dv = 0;
                fm->dvsize = 0;
              }
              if (should_trim(fm, tsize))
                sys_trim(fm, 0);
              goto postaction;
            }
            else if (next == fm->dv) {
              size_t dsize = fm->dvsize += psize;
              fm->dv = p;
              set_size_and_pinuse_of_free_chunk(p, dsize);
              goto postaction;
            }
            else {
              size_t nsize = chunksize(next);
              psize += nsize;
              unlink_chunk(fm, next, nsize);
              set_size_and_pinuse_of_free_chunk(p, psize);
              if (p == fm->dv) {
                fm->dvsize = psize;
                goto postaction;
              }
            }
          }
          else
            set_free_with_pinuse(p, psize, next);

          if (is_small(psize)) {
            insert_small_chunk(fm, p, psize);
            check_free_chunk(fm, p);
          }
          else {
            tchunkptr tp = (tchunkptr)p;
            insert_large_chunk(fm, tp, psize);
            check_free_chunk(fm, p);
            if (--fm->release_checks == 0)
              release_unused_segments(fm);
          }
          goto postaction;
        }
      }
    erroraction:
      USAGE_ERROR_ACTION(fm, p);
    postaction:
      POSTACTION(fm);
    }
  }
}